

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

void LogAllAvailableFormats(snd_pcm_t *pcm)

{
  long lVar1;
  size_t __n;
  undefined1 *__s;
  undefined8 uStack_20;
  
  uStack_20 = 0x110ca9;
  __n = snd_pcm_hw_params_sizeof();
  lVar1 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = &stack0xffffffffffffffe8 + lVar1;
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110cc7;
  memset(__s,0,__n);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110cd2;
  snd_pcm_hw_params_any(pcm,__s);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110cdf;
  snd_pcm_hw_params_test_format(pcm,__s,0);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110cef;
  snd_pcm_hw_params_test_format(pcm,__s,1);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110cff;
  snd_pcm_hw_params_test_format(pcm,__s,2);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110d0f;
  snd_pcm_hw_params_test_format(pcm,__s,3);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110d1f;
  snd_pcm_hw_params_test_format(pcm,__s,4);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110d2f;
  snd_pcm_hw_params_test_format(pcm,__s,5);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110d3f;
  snd_pcm_hw_params_test_format(pcm,__s,6);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110d4f;
  snd_pcm_hw_params_test_format(pcm,__s,7);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110d5f;
  snd_pcm_hw_params_test_format(pcm,__s,8);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110d6f;
  snd_pcm_hw_params_test_format(pcm,__s,9);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110d7f;
  snd_pcm_hw_params_test_format(pcm,__s,0xe);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110d8f;
  snd_pcm_hw_params_test_format(pcm,__s,0xf);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110d9f;
  snd_pcm_hw_params_test_format(pcm,__s,0x10);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110daf;
  snd_pcm_hw_params_test_format(pcm,__s,0x11);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110dbf;
  snd_pcm_hw_params_test_format(pcm,__s,0x12);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110dcf;
  snd_pcm_hw_params_test_format(pcm,__s,0x13);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110ddf;
  snd_pcm_hw_params_test_format(pcm,__s,0x14);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110def;
  snd_pcm_hw_params_test_format(pcm,__s,0x15);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110dff;
  snd_pcm_hw_params_test_format(pcm,__s,0x16);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110e0f;
  snd_pcm_hw_params_test_format(pcm,__s,0x17);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110e1f;
  snd_pcm_hw_params_test_format(pcm,__s,0x18);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110e2f;
  snd_pcm_hw_params_test_format(pcm,__s,0x1f);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110e3f;
  snd_pcm_hw_params_test_format(pcm,__s,0x20);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110e4f;
  snd_pcm_hw_params_test_format(pcm,__s,0x21);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110e5f;
  snd_pcm_hw_params_test_format(pcm,__s,0x22);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110e6f;
  snd_pcm_hw_params_test_format(pcm,__s,0x23);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110e7f;
  snd_pcm_hw_params_test_format(pcm,__s,0x24);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110e8f;
  snd_pcm_hw_params_test_format(pcm,__s,0x25);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110e9f;
  snd_pcm_hw_params_test_format(pcm,__s,0x26);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110eaf;
  snd_pcm_hw_params_test_format(pcm,__s,0x27);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110ebf;
  snd_pcm_hw_params_test_format(pcm,__s,0x28);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110ecf;
  snd_pcm_hw_params_test_format(pcm,__s,0x29);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110edf;
  snd_pcm_hw_params_test_format(pcm,__s,0x2a);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110eef;
  snd_pcm_hw_params_test_format(pcm,__s,0x2b);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110eff;
  snd_pcm_hw_params_test_format(pcm,__s,2);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110f0f;
  snd_pcm_hw_params_test_format(pcm,__s,4);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110f1f;
  snd_pcm_hw_params_test_format(pcm,__s,6);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110f2f;
  snd_pcm_hw_params_test_format(pcm,__s,8);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110f3f;
  snd_pcm_hw_params_test_format(pcm,__s,10);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110f4f;
  snd_pcm_hw_params_test_format(pcm,__s,0xc);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110f5f;
  snd_pcm_hw_params_test_format(pcm,__s,0xe);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110f6f;
  snd_pcm_hw_params_test_format(pcm,__s,0x10);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x110f7f;
  snd_pcm_hw_params_test_format(pcm,__s,0x12);
  return;
}

Assistant:

static void LogAllAvailableFormats( snd_pcm_t *pcm )
{
    PaSampleFormat available = 0;
    snd_pcm_hw_params_t *hwParams;
    alsa_snd_pcm_hw_params_alloca( &hwParams );

    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    PA_DEBUG(( " --- Supported Formats ---\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S8 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S8\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U8 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U8\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_MU_LAW ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_MU_LAW\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_A_LAW ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_A_LAW\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IMA_ADPCM ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IMA_ADPCM\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_MPEG ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_MPEG\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_GSM ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_GSM\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_SPECIAL ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_SPECIAL\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S20_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S20_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S20_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S20_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U20_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U20_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U20_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U20_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S18_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S18_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S18_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S18_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U18_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U18_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U18_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U18_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S32 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S32\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U32 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U32\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME\n" ));

    PA_DEBUG(( " -------------------------\n" ));
}